

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode multi_runsingle(Curl_multi *multi,curltime now,Curl_easy *data)

{
  curltime now_00;
  curltime now_01;
  curltime now_02;
  curltime now_03;
  Curl_message *data_00;
  _Bool _Var1;
  CURLcode CVar2;
  int iVar3;
  timediff_t tVar4;
  CURLMstate CVar5;
  curltime now_04;
  curltime now_05;
  curltime now_06;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime newer_02;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime older_02;
  curltime start;
  curltime start_00;
  curltime start_01;
  curltime start_02;
  _Bool local_e9;
  followtype fStack_b8;
  _Bool dead_connection;
  CURLcode res;
  followtype follow_1;
  CURLcode ret_1;
  CURLcode ret;
  _Bool comeback;
  _Bool retry;
  char *newurl_1;
  CURLcode drc;
  followtype follow;
  char *newurl;
  WildcardData *wc;
  char *hostname;
  connectdata *conn;
  Curl_dns_entry *dns;
  SingleRequest *k;
  _Bool stream_error;
  timediff_t tStack_60;
  int control;
  timediff_t send_timeout_ms;
  timediff_t recv_timeout_ms;
  timediff_t timeout_ms;
  CURLcode result;
  CURLMcode rc;
  _Bool done;
  _Bool dophase_done;
  _Bool protocol_connect;
  _Bool async;
  curl_llist_element **ppcStack_38;
  _Bool connected;
  Curl_message *msg;
  Curl_easy *data_local;
  Curl_multi *multi_local;
  curltime now_local;
  
  multi_local = (Curl_multi *)now.tv_sec;
  now_local.tv_sec._0_4_ = now.tv_usec;
  ppcStack_38 = (curl_llist_element **)0x0;
  rc._1_1_ = CURLM_OK >> 8;
  rc._0_1_ = CURLM_OK;
  result._3_1_ = CURLE_OK >> 0x18;
  timeout_ms._0_4_ = CURLE_OK;
  if ((data == (Curl_easy *)0x0) ||
     (msg = (Curl_message *)data, data_local = (Curl_easy *)multi, data->magic != 0xc0dedbad)) {
    now_local._12_4_ = 2;
  }
  else {
    do {
      k._3_1_ = 0;
      timeout_ms._4_4_ = CURLM_OK;
      if ((((msg->list).next == (curl_llist_element *)0x0) && (2 < *(uint *)&msg[2].list.ptr)) &&
         (*(uint *)&msg[2].list.ptr < 0xe)) {
        Curl_failf((Curl_easy *)msg,"In state %d with no conn, bail out!\n",
                   (ulong)*(uint *)&msg[2].list.ptr);
        return CURLM_INTERNAL_ERROR;
      }
      _Var1 = multi_ischanged((Curl_multi *)data_local,true);
      if (_Var1) {
        process_pending_handles((Curl_multi *)data_local);
      }
      if ((((msg->list).next != (curl_llist_element *)0x0) && (2 < *(uint *)&msg[2].list.ptr)) &&
         (*(uint *)&msg[2].list.ptr < 0xf)) {
        ((msg->list).next)->ptr = msg;
      }
      if ((((msg->list).next == (curl_llist_element *)0x0) || (*(uint *)&msg[2].list.ptr < 2)) ||
         ((0xe < *(uint *)&msg[2].list.ptr ||
          (recv_timeout_ms =
                Curl_timeleft((Curl_easy *)msg,(curltime *)&multi_local,
                              *(uint *)&msg[2].list.ptr < 9), data_00 = msg, -1 < recv_timeout_ms)))
         ) {
        switch(*(undefined4 *)&msg[2].list.ptr) {
        case 0:
          timeout_ms._0_4_ = Curl_pretransfer((Curl_easy *)msg);
          if ((CURLcode)timeout_ms == CURLE_OK) {
            mstate((Curl_easy *)msg,CURLM_STATE_CONNECT);
            Curl_pgrsTime((Curl_easy *)msg,TIMER_STARTOP);
            timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
          }
          break;
        case 1:
          break;
        case 2:
          Curl_pgrsTime((Curl_easy *)msg,TIMER_STARTSINGLE);
          if (msg[0x28].extmsg.easy_handle != (CURL_conflict *)0x0) {
            Curl_expire((Curl_easy *)msg,(time_t)msg[0x28].extmsg.easy_handle,EXPIRE_TIMEOUT);
          }
          if (msg[0x28].extmsg.data.whatever != (void *)0x0) {
            Curl_expire((Curl_easy *)msg,(time_t)msg[0x28].extmsg.data,EXPIRE_CONNECTTIMEOUT);
          }
          timeout_ms._0_4_ =
               Curl_connect((Curl_easy *)msg,(_Bool *)((long)&rc + 2),(_Bool *)((long)&rc + 1));
          if ((CURLcode)timeout_ms == CURLE_NO_CONNECTION_AVAILABLE) {
            mstate((Curl_easy *)msg,CURLM_STATE_CONNECT_PEND);
            Curl_llist_insert_next
                      ((curl_llist *)&(data_local->sh_queue).next,
                       (curl_llist_element *)(data_local->conn_queue).ptr,msg,
                       (curl_llist_element *)&msg->extmsg);
            timeout_ms._0_4_ = CURLE_OK;
          }
          else {
            if ((*(ushort *)((long)&msg[0x72].extmsg.easy_handle + 4) >> 0xd & 1) != 0) {
              Curl_infof((Curl_easy *)msg,"Transfer was pending, now try another\n");
              process_pending_handles(*(Curl_multi **)&msg[4].extmsg);
            }
            if ((CURLcode)timeout_ms == CURLE_OK) {
              if ((rc._2_1_ & 1) == CURLM_OK >> 0x10) {
                timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
                if ((rc._1_1_ & 1) == CURLM_OK >> 8) {
                  _Var1 = Curl_connect_ongoing((connectdata *)(msg->list).next);
                  if (_Var1) {
                    mstate((Curl_easy *)msg,CURLM_STATE_WAITPROXYCONNECT);
                  }
                  else {
                    mstate((Curl_easy *)msg,CURLM_STATE_WAITCONNECT);
                  }
                }
                else {
                  mstate((Curl_easy *)msg,CURLM_STATE_DO);
                }
              }
              else {
                mstate((Curl_easy *)msg,CURLM_STATE_WAITRESOLVE);
              }
            }
          }
          break;
        case 3:
          conn = (connectdata *)0x0;
          hostname = (char *)(msg->list).next;
          if ((*(uint *)&(((connectdata *)hostname)->bits).field_0x4 >> 5 & 1) == 0) {
            if ((*(uint *)&(((connectdata *)hostname)->bits).field_0x4 >> 2 & 1) == 0) {
              wc = (WildcardData *)(((connectdata *)hostname)->host).name;
            }
            else {
              wc = (WildcardData *)(((connectdata *)hostname)->conn_to_host).name;
            }
          }
          else {
            wc = (WildcardData *)(((connectdata *)hostname)->http_proxy).host.name;
          }
          conn = (connectdata *)
                 Curl_fetch_addr((connectdata *)hostname,(char *)wc,
                                 (int)((connectdata *)hostname)->port);
          if (conn != (connectdata *)0x0) {
            timeout_ms._0_4_ = CURLE_OK;
            Curl_infof((Curl_easy *)msg,"Hostname \'%s\' was found in DNS cache\n",wc);
          }
          if (conn == (connectdata *)0x0) {
            timeout_ms._0_4_ =
                 Curl_resolv_check((connectdata *)(msg->list).next,(Curl_dns_entry **)&conn);
          }
          singlesocket((Curl_multi *)data_local,(Curl_easy *)msg);
          if (conn != (connectdata *)0x0) {
            timeout_ms._0_4_ =
                 Curl_once_resolved((connectdata *)(msg->list).next,(_Bool *)((long)&rc + 1));
            if ((CURLcode)timeout_ms == CURLE_OK) {
              timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
              if ((rc._1_1_ & 1) == CURLM_OK >> 8) {
                _Var1 = Curl_connect_ongoing((connectdata *)(msg->list).next);
                if (_Var1) {
                  mstate((Curl_easy *)msg,CURLM_STATE_WAITPROXYCONNECT);
                }
                else {
                  mstate((Curl_easy *)msg,CURLM_STATE_WAITCONNECT);
                }
              }
              else {
                mstate((Curl_easy *)msg,CURLM_STATE_DO);
              }
            }
            else {
              (msg->list).next = (curl_llist_element *)0x0;
            }
          }
          if ((CURLcode)timeout_ms != CURLE_OK) {
            k._3_1_ = 1;
          }
          break;
        case 4:
          timeout_ms._0_4_ =
               Curl_is_connected((connectdata *)(msg->list).next,0,(_Bool *)((long)&rc + 3));
          if (((rc._3_1_ & 1) == CURLM_OK >> 0x18) || ((CURLcode)timeout_ms != CURLE_OK)) {
            if ((CURLcode)timeout_ms != CURLE_OK) {
              Curl_posttransfer((Curl_easy *)msg);
              multi_done((Curl_easy *)msg,(CURLcode)timeout_ms,true);
              k._3_1_ = 1;
            }
          }
          else if (((*(int *)&(msg->list).next[0xf].next == 2) &&
                   (((ulong)(msg->list).next[0x27].ptr & 1) == 0)) ||
                  (_Var1 = Curl_connect_ongoing((connectdata *)(msg->list).next), _Var1)) {
            mstate((Curl_easy *)msg,CURLM_STATE_WAITPROXYCONNECT);
          }
          else {
            timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
            CVar5 = CURLM_STATE_SENDPROTOCONNECT;
            if ((*(uint *)((long)&(msg->list).next[0x27].ptr + 4) >> 0xe & 1) != 0) {
              CVar5 = CURLM_STATE_WAITPROXYCONNECT;
            }
            mstate((Curl_easy *)msg,CVar5);
          }
          break;
        case 5:
          timeout_ms._0_4_ =
               Curl_http_connect((connectdata *)(msg->list).next,(_Bool *)((long)&rc + 1));
          if ((*(uint *)((long)&(msg->list).next[0x27].ptr + 4) >> 0x17 & 1) == 0) {
            if ((CURLcode)timeout_ms == CURLE_OK) {
              if (((*(int *)&(msg->list).next[0xf].next != 2) ||
                  (((ulong)(msg->list).next[0x27].ptr & 1) != 0)) &&
                 (_Var1 = Curl_connect_complete((connectdata *)(msg->list).next), _Var1)) {
                timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
                mstate((Curl_easy *)msg,CURLM_STATE_SENDPROTOCONNECT);
              }
            }
            else if ((CURLcode)timeout_ms != CURLE_OK) {
              k._3_1_ = 1;
            }
          }
          else {
            timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
            timeout_ms._0_4_ = CURLE_OK;
            multi_done((Curl_easy *)msg,CURLE_OK,false);
            mstate((Curl_easy *)msg,CURLM_STATE_CONNECT);
          }
          break;
        case 6:
          timeout_ms._0_4_ =
               Curl_protocol_connect((connectdata *)(msg->list).next,(_Bool *)((long)&rc + 1));
          if (((CURLcode)timeout_ms == CURLE_OK) && ((rc._1_1_ & 1) == CURLM_OK >> 8)) {
            mstate((Curl_easy *)msg,CURLM_STATE_PROTOCONNECT);
          }
          else if ((CURLcode)timeout_ms == CURLE_OK) {
            mstate((Curl_easy *)msg,CURLM_STATE_DO);
            timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
          }
          else if ((CURLcode)timeout_ms != CURLE_OK) {
            Curl_posttransfer((Curl_easy *)msg);
            multi_done((Curl_easy *)msg,(CURLcode)timeout_ms,true);
            k._3_1_ = 1;
          }
          break;
        case 7:
          timeout_ms._0_4_ =
               Curl_protocol_connecting((connectdata *)(msg->list).next,(_Bool *)((long)&rc + 1));
          if (((CURLcode)timeout_ms == CURLE_OK) && ((rc._1_1_ & 1) != CURLM_OK >> 8)) {
            mstate((Curl_easy *)msg,CURLM_STATE_DO);
            timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
          }
          else if ((CURLcode)timeout_ms != CURLE_OK) {
            Curl_posttransfer((Curl_easy *)msg);
            multi_done((Curl_easy *)msg,(CURLcode)timeout_ms,true);
            k._3_1_ = 1;
          }
          break;
        case 8:
          if (((ulong)msg[0x4f].list.next >> 0x25 & 1) == 0) {
            timeout_ms._0_4_ = multi_do((Curl_easy *)msg,(_Bool *)&rc);
            if ((CURLcode)timeout_ms == CURLE_OK) {
              if (((undefined1)rc & CURLM_BAD_HANDLE) == CURLM_OK) {
                if (((*(ushort *)((long)&msg[0x72].extmsg.easy_handle + 4) >> 7 & 1) == 0) ||
                   ((newurl = (char *)&msg[0x72].extmsg.data,
                    *(CURLcode *)newurl != CURLE_COULDNT_CONNECT &&
                    (*(CURLcode *)newurl != CURLE_COULDNT_RESOLVE_PROXY)))) {
                  mstate((Curl_easy *)msg,CURLM_STATE_DOING);
                  timeout_ms._4_4_ = CURLM_OK;
                }
                else {
                  multi_done((Curl_easy *)msg,CURLE_OK,false);
                  mstate((Curl_easy *)msg,CURLM_STATE_DONE);
                  timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
                }
              }
              else if ((*(uint *)((long)&(msg->list).next[0x27].ptr + 4) >> 0xb & 1) == 0) {
                mstate((Curl_easy *)msg,CURLM_STATE_DO_DONE);
                timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
              }
              else {
                mstate((Curl_easy *)msg,CURLM_STATE_DO_MORE);
                timeout_ms._4_4_ = CURLM_OK;
              }
            }
            else if (((CURLcode)timeout_ms == CURLE_SEND_ERROR) &&
                    ((*(uint *)((long)&(msg->list).next[0x27].ptr + 4) >> 1 & 1) != 0)) {
              _drc = (char *)0x0;
              newurl_1._4_4_ = 0;
              newurl_1._0_4_ = Curl_retry_request((connectdata *)(msg->list).next,(char **)&drc);
              if ((CURLcode)newurl_1 != CURLE_OK) {
                k._3_1_ = 1;
                timeout_ms._0_4_ = (CURLcode)newurl_1;
              }
              Curl_posttransfer((Curl_easy *)msg);
              newurl_1._0_4_ = multi_done((Curl_easy *)msg,(CURLcode)timeout_ms,false);
              if (_drc == (char *)0x0) {
                k._3_1_ = 1;
                CVar2 = (CURLcode)timeout_ms;
              }
              else if (((CURLcode)newurl_1 == CURLE_OK) ||
                      (CVar2 = (CURLcode)newurl_1, (CURLcode)newurl_1 == CURLE_SEND_ERROR)) {
                newurl_1._4_4_ = 2;
                newurl_1._0_4_ = Curl_follow((Curl_easy *)msg,_drc,FOLLOW_RETRY);
                CVar2 = (CURLcode)newurl_1;
                if ((CURLcode)newurl_1 == CURLE_OK) {
                  mstate((Curl_easy *)msg,CURLM_STATE_CONNECT);
                  timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
                  timeout_ms._0_4_ = CURLE_OK;
                  CVar2 = (CURLcode)timeout_ms;
                }
              }
              timeout_ms._0_4_ = CVar2;
              (*Curl_cfree)(_drc);
            }
            else {
              Curl_posttransfer((Curl_easy *)msg);
              if ((msg->list).next != (curl_llist_element *)0x0) {
                multi_done((Curl_easy *)msg,(CURLcode)timeout_ms,false);
              }
              k._3_1_ = 1;
            }
          }
          else {
            Curl_conncontrol((connectdata *)(msg->list).next,0);
            mstate((Curl_easy *)msg,CURLM_STATE_DONE);
            timeout_ms._0_4_ = CURLE_OK;
            timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
          }
          break;
        case 9:
          timeout_ms._0_4_ = Curl_protocol_doing((connectdata *)(msg->list).next,(_Bool *)&rc);
          if ((CURLcode)timeout_ms == CURLE_OK) {
            if (((undefined1)rc & CURLM_BAD_HANDLE) != CURLM_OK) {
              CVar5 = CURLM_STATE_DO_DONE;
              if ((*(uint *)((long)&(msg->list).next[0x27].ptr + 4) >> 0xb & 1) != 0) {
                CVar5 = CURLM_STATE_DO_MORE;
              }
              mstate((Curl_easy *)msg,CVar5);
              timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
            }
          }
          else {
            Curl_posttransfer((Curl_easy *)msg);
            multi_done((Curl_easy *)msg,(CURLcode)timeout_ms,false);
            k._3_1_ = 1;
          }
          break;
        case 10:
          timeout_ms._0_4_ = multi_do_more((connectdata *)(msg->list).next,(int *)((long)&k + 4));
          if ((CURLcode)timeout_ms == CURLE_OK) {
            if (k._4_4_ == 0) {
              timeout_ms._4_4_ = CURLM_OK;
            }
            else {
              CVar5 = CURLM_STATE_DOING;
              if (k._4_4_ == 1) {
                CVar5 = CURLM_STATE_DO_DONE;
              }
              mstate((Curl_easy *)msg,CVar5);
              timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
            }
          }
          else {
            Curl_posttransfer((Curl_easy *)msg);
            multi_done((Curl_easy *)msg,(CURLcode)timeout_ms,false);
            k._3_1_ = 1;
          }
          break;
        case 0xb:
          if ((*(uint *)((long)&(msg->list).next[0x27].ptr + 4) >> 0x1a & 1) != 0) {
            process_pending_handles((Curl_multi *)data_local);
          }
          if ((*(int *)&(msg->list).next[0x2a].next == -1) &&
             (*(int *)((long)&(msg->list).next[0x2a].next + 4) == -1)) {
            if (((*(ushort *)((long)&msg[0x72].extmsg.easy_handle + 4) >> 7 & 1) != 0) &&
               (((ulong)(msg->list).next[0x28].next[5].prev & 0x100000000000) == 0)) {
              msg[0x72].extmsg.data.result = CURLE_COULDNT_CONNECT;
            }
            mstate((Curl_easy *)msg,CURLM_STATE_DONE);
          }
          else {
            mstate((Curl_easy *)msg,CURLM_STATE_PERFORM);
          }
          timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
          break;
        case 0xc:
          _ret = (CURL_conflict *)0x0;
          ret_1._3_1_ = CURLE_OK >> 0x18;
          ret_1._2_1_ = CURLE_OK >> 0x10;
          tStack_60 = 0;
          if (0 < (long)msg[0x2a].list.next) {
            now_02._12_4_ = now_local.tv_sec._4_4_;
            now_02.tv_usec = (int)now_local.tv_sec;
            now_02.tv_sec = (time_t)multi_local;
            start_01._12_4_ = 0;
            start_01._0_12_ = *(undefined1 (*) [12])&msg[0x54].extmsg;
            tStack_60 = Curl_pgrsLimitWaitTime
                                  ((curl_off_t)msg[0x51].list.prev,(curl_off_t)msg[0x54].extmsg.data
                                   ,(curl_off_t)msg[0x2a].list.next,start_01,now_02);
          }
          send_timeout_ms = 0;
          if (0 < *(long *)&msg[0x2a].extmsg) {
            now_03._12_4_ = now_local.tv_sec._4_4_;
            now_03.tv_usec = (int)now_local.tv_sec;
            now_03.tv_sec = (time_t)multi_local;
            start_02._12_4_ = 0;
            start_02._0_12_ = *(undefined1 (*) [12])&msg[0x55].list;
            send_timeout_ms =
                 Curl_pgrsLimitWaitTime
                           ((curl_off_t)msg[0x51].list.ptr,(curl_off_t)msg[0x55].list.next,
                            *(curl_off_t *)&msg[0x2a].extmsg,start_02,now_03);
          }
          if ((tStack_60 == 0) && (send_timeout_ms == 0)) {
            timeout_ms._0_4_ =
                 Curl_readwrite((connectdata *)(msg->list).next,(Curl_easy *)msg,
                                (_Bool *)((long)&result + 3),(_Bool *)((long)&ret_1 + 2));
            if (((result._3_1_ & 1) != CURLE_OK >> 0x18) ||
               ((CURLcode)timeout_ms == CURLE_RECV_ERROR)) {
              CVar2 = Curl_retry_request((connectdata *)(msg->list).next,(char **)&ret);
              if (CVar2 == CURLE_OK) {
                ret_1._3_1_ = _ret != (CURL_conflict *)0x0;
              }
              else if ((CURLcode)timeout_ms == CURLE_OK) {
                timeout_ms._0_4_ = CVar2;
              }
              if ((ret_1._3_1_ & 1) != CURLE_OK >> 0x18) {
                timeout_ms._0_4_ = CURLE_OK;
                result._3_1_ = 1;
              }
            }
            if ((CURLcode)timeout_ms == CURLE_OK) {
              if ((result._3_1_ & 1) == CURLE_OK >> 0x18) {
                if ((ret_1._2_1_ & 1) != CURLE_OK >> 0x10) {
                  timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
                }
              }
              else {
                Curl_posttransfer((Curl_easy *)msg);
                if ((msg[9].extmsg.easy_handle == (CURL_conflict *)0x0) &&
                   ((ret_1._3_1_ & 1) == CURLE_OK >> 0x18)) {
                  if (*(long *)&msg[9].extmsg != 0) {
                    (*Curl_cfree)(_ret);
                    _ret = *(CURL_conflict **)&msg[9].extmsg;
                    *(undefined8 *)&msg[9].extmsg = 0;
                    timeout_ms._0_4_ = Curl_follow((Curl_easy *)msg,(char *)_ret,FOLLOW_FAKE);
                    (*Curl_cfree)(_ret);
                    if ((CURLcode)timeout_ms != CURLE_OK) {
                      k._3_1_ = 1;
                      timeout_ms._0_4_ = multi_done((Curl_easy *)msg,(CURLcode)timeout_ms,true);
                    }
                  }
                  if ((CURLcode)timeout_ms == CURLE_OK) {
                    mstate((Curl_easy *)msg,CURLM_STATE_DONE);
                    timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
                  }
                }
                else {
                  if ((ret_1._3_1_ & 1) == CURLE_OK >> 0x18) {
                    (*Curl_cfree)(_ret);
                    _ret = msg[9].extmsg.easy_handle;
                    msg[9].extmsg.easy_handle = (CURL_conflict *)0x0;
                    fStack_b8 = FOLLOW_REDIR;
                  }
                  else {
                    fStack_b8 = FOLLOW_RETRY;
                  }
                  multi_done((Curl_easy *)msg,CURLE_OK,false);
                  timeout_ms._0_4_ = Curl_follow((Curl_easy *)msg,(char *)_ret,fStack_b8);
                  if ((CURLcode)timeout_ms == CURLE_OK) {
                    mstate((Curl_easy *)msg,CURLM_STATE_CONNECT);
                    timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
                  }
                  (*Curl_cfree)(_ret);
                }
              }
            }
            else {
              if ((((ulong)(msg->list).next[0x28].next[5].prev & 0x200000000) == 0) &&
                 ((CURLcode)timeout_ms != CURLE_HTTP2_STREAM)) {
                Curl_conncontrol((connectdata *)(msg->list).next,2);
              }
              Curl_posttransfer((Curl_easy *)msg);
              multi_done((Curl_easy *)msg,(CURLcode)timeout_ms,true);
            }
          }
          else {
            now_06.tv_usec = (int)now_local.tv_sec;
            now_06.tv_sec = (time_t)multi_local;
            now_06._12_4_ = 0;
            Curl_ratelimit((Curl_easy *)msg,now_06);
            mstate((Curl_easy *)msg,CURLM_STATE_TOOFAST);
            if (tStack_60 < send_timeout_ms) {
              Curl_expire((Curl_easy *)msg,send_timeout_ms,EXPIRE_TOOFAST);
            }
            else {
              Curl_expire((Curl_easy *)msg,tStack_60,EXPIRE_TOOFAST);
            }
          }
          break;
        case 0xd:
          iVar3 = Curl_pgrsUpdate((connectdata *)(msg->list).next);
          if (iVar3 == 0) {
            now_04.tv_usec = (int)now_local.tv_sec;
            now_04.tv_sec = (time_t)multi_local;
            now_04._12_4_ = 0;
            timeout_ms._0_4_ = Curl_speedcheck((Curl_easy *)msg,now_04);
          }
          else {
            timeout_ms._0_4_ = CURLE_ABORTED_BY_CALLBACK;
          }
          if ((CURLcode)timeout_ms == CURLE_OK) {
            tStack_60 = 0;
            if (0 < (long)msg[0x2a].list.next) {
              now_00._12_4_ = now_local.tv_sec._4_4_;
              now_00.tv_usec = (int)now_local.tv_sec;
              now_00.tv_sec = (time_t)multi_local;
              start._12_4_ = 0;
              start._0_12_ = *(undefined1 (*) [12])&msg[0x54].extmsg;
              tStack_60 = Curl_pgrsLimitWaitTime
                                    ((curl_off_t)msg[0x51].list.prev,
                                     (curl_off_t)msg[0x54].extmsg.data,
                                     (curl_off_t)msg[0x2a].list.next,start,now_00);
            }
            send_timeout_ms = 0;
            if (0 < *(long *)&msg[0x2a].extmsg) {
              now_01._12_4_ = now_local.tv_sec._4_4_;
              now_01.tv_usec = (int)now_local.tv_sec;
              now_01.tv_sec = (time_t)multi_local;
              start_00._12_4_ = 0;
              start_00._0_12_ = *(undefined1 (*) [12])&msg[0x55].list;
              send_timeout_ms =
                   Curl_pgrsLimitWaitTime
                             ((curl_off_t)msg[0x51].list.ptr,(curl_off_t)msg[0x55].list.next,
                              *(curl_off_t *)&msg[0x2a].extmsg,start_00,now_01);
            }
            if ((tStack_60 == 0) && (send_timeout_ms == 0)) {
              mstate((Curl_easy *)msg,CURLM_STATE_PERFORM);
              now_05.tv_usec = (int)now_local.tv_sec;
              now_05.tv_sec = (time_t)multi_local;
              now_05._12_4_ = 0;
              Curl_ratelimit((Curl_easy *)msg,now_05);
            }
            else if (tStack_60 < send_timeout_ms) {
              Curl_expire((Curl_easy *)msg,send_timeout_ms,EXPIRE_TOOFAST);
            }
            else {
              Curl_expire((Curl_easy *)msg,tStack_60,EXPIRE_TOOFAST);
            }
          }
          break;
        case 0xe:
          timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
          if ((msg->list).next != (curl_llist_element *)0x0) {
            if ((*(uint *)((long)&(msg->list).next[0x27].ptr + 4) >> 0x1a & 1) != 0) {
              process_pending_handles((Curl_multi *)data_local);
            }
            CVar2 = multi_done((Curl_easy *)msg,(CURLcode)timeout_ms,false);
            if ((CURLcode)timeout_ms == CURLE_OK) {
              timeout_ms._0_4_ = CVar2;
            }
            if ((msg->list).next != (curl_llist_element *)0x0) {
              detach_connnection((Curl_easy *)msg);
            }
          }
          if (((*(ushort *)((long)&msg[0x72].extmsg.easy_handle + 4) >> 7 & 1) == 0) ||
             (msg[0x72].extmsg.data.result == CURLE_COULDNT_CONNECT)) {
            mstate((Curl_easy *)msg,CURLM_STATE_COMPLETED);
          }
          else {
            mstate((Curl_easy *)msg,CURLM_STATE_INIT);
          }
          break;
        case 0xf:
          break;
        case 0x10:
          *(CURLcode *)((long)&msg[2].list.ptr + 4) = (CURLcode)timeout_ms;
          return CURLM_OK;
        default:
          return CURLM_INTERNAL_ERROR;
        }
      }
      else {
        if (*(int *)&msg[2].list.ptr == 3) {
          newer.tv_usec = (int)now_local.tv_sec;
          newer.tv_sec = (time_t)multi_local;
          newer._12_4_ = 0;
          older._12_4_ = 0;
          older._0_12_ = *(undefined1 (*) [12])&msg[0x53].extmsg;
          tVar4 = Curl_timediff(newer,older);
          Curl_failf((Curl_easy *)data_00,"Resolving timed out after %ld milliseconds",tVar4);
        }
        else if (*(int *)&msg[2].list.ptr == 4) {
          newer_00.tv_usec = (int)now_local.tv_sec;
          newer_00.tv_sec = (time_t)multi_local;
          newer_00._12_4_ = 0;
          older_00._12_4_ = 0;
          older_00._0_12_ = *(undefined1 (*) [12])&msg[0x53].extmsg;
          tVar4 = Curl_timediff(newer_00,older_00);
          Curl_failf((Curl_easy *)data_00,"Connection timed out after %ld milliseconds",tVar4);
        }
        else {
          dns = (Curl_dns_entry *)(msg + 5);
          if ((Curl_addrinfo *)(((Curl_message *)dns)->list).ptr ==
              (Curl_addrinfo *)0xffffffffffffffff) {
            newer_02.tv_usec = (int)now_local.tv_sec;
            newer_02.tv_sec = (time_t)multi_local;
            newer_02._12_4_ = 0;
            older_02._12_4_ = 0;
            older_02._0_12_ = *(undefined1 (*) [12])&msg[0x53].extmsg;
            tVar4 = Curl_timediff(newer_02,older_02);
            Curl_failf((Curl_easy *)data_00,
                       "Operation timed out after %ld milliseconds with %ld bytes received",tVar4,
                       dns->inuse);
          }
          else {
            newer_01.tv_usec = (int)now_local.tv_sec;
            newer_01.tv_sec = (time_t)multi_local;
            newer_01._12_4_ = 0;
            older_01._12_4_ = 0;
            older_01._0_12_ = *(undefined1 (*) [12])&msg[0x53].extmsg;
            tVar4 = Curl_timediff(newer_01,older_01);
            Curl_failf((Curl_easy *)data_00,
                       "Operation timed out after %ld milliseconds with %ld out of %ld bytes received"
                       ,tVar4,dns->inuse,dns->addr);
          }
        }
        if (8 < *(uint *)&msg[2].list.ptr) {
          Curl_conncontrol((connectdata *)(msg->list).next,2);
          k._3_1_ = 1;
        }
        timeout_ms._0_4_ = CURLE_OPERATION_TIMEDOUT;
        multi_done((Curl_easy *)msg,CURLE_OPERATION_TIMEDOUT,true);
      }
      if (*(uint *)&msg[2].list.ptr < 0xf) {
        if ((CURLcode)timeout_ms == CURLE_OK) {
          if (((msg->list).next != (curl_llist_element *)0x0) &&
             (iVar3 = Curl_pgrsUpdate((connectdata *)(msg->list).next), iVar3 != 0)) {
            timeout_ms._0_4_ = CURLE_ABORTED_BY_CALLBACK;
            Curl_conncontrol((connectdata *)(msg->list).next,2);
            CVar5 = CURLM_STATE_COMPLETED;
            if (*(uint *)&msg[2].list.ptr < 0xe) {
              CVar5 = CURLM_STATE_DONE;
            }
            mstate((Curl_easy *)msg,CVar5);
            timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
          }
        }
        else {
          process_pending_handles((Curl_multi *)data_local);
          if ((msg->list).next == (curl_llist_element *)0x0) {
            if (*(int *)&msg[2].list.ptr == 2) {
              Curl_posttransfer((Curl_easy *)msg);
            }
          }
          else if ((k._3_1_ & 1) != 0) {
            Curl_disconnect((Curl_easy *)msg,(connectdata *)(msg->list).next,
                            (CURLcode)timeout_ms == CURLE_OPERATION_TIMEDOUT);
            detach_connnection((Curl_easy *)msg);
          }
          mstate((Curl_easy *)msg,CURLM_STATE_COMPLETED);
          timeout_ms._4_4_ = CURLM_CALL_MULTI_PERFORM;
        }
      }
      if (*(int *)&msg[2].list.ptr == 0xf) {
        if (*(long *)&msg[0x4e].extmsg == 0) {
          ppcStack_38 = &msg[2].list.prev;
          *(undefined4 *)&msg[2].extmsg.easy_handle = 1;
          msg[2].extmsg.data.whatever = msg;
          *(CURLcode *)&msg[3].list.ptr = (CURLcode)timeout_ms;
          timeout_ms._4_4_ = multi_addmsg((Curl_multi *)data_local,(Curl_message *)ppcStack_38);
        }
        else {
          (**(code **)&msg[0x4e].extmsg)(msg,(CURLcode)timeout_ms);
        }
        mstate((Curl_easy *)msg,CURLM_STATE_MSGSENT);
      }
      local_e9 = true;
      if (timeout_ms._4_4_ != CURLM_CALL_MULTI_PERFORM) {
        local_e9 = multi_ischanged((Curl_multi *)data_local,false);
      }
    } while (local_e9 != false);
    *(CURLcode *)((long)&msg[2].list.ptr + 4) = (CURLcode)timeout_ms;
    now_local._12_4_ = timeout_ms._4_4_;
  }
  return now_local._12_4_;
}

Assistant:

static CURLMcode multi_runsingle(struct Curl_multi *multi,
                                 struct curltime now,
                                 struct Curl_easy *data)
{
  struct Curl_message *msg = NULL;
  bool connected;
  bool async;
  bool protocol_connect = FALSE;
  bool dophase_done = FALSE;
  bool done = FALSE;
  CURLMcode rc;
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms;
  timediff_t recv_timeout_ms;
  timediff_t send_timeout_ms;
  int control;

  if(!GOOD_EASY_HANDLE(data))
    return CURLM_BAD_EASY_HANDLE;

  do {
    /* A "stream" here is a logical stream if the protocol can handle that
       (HTTP/2), or the full connection for older protocols */
    bool stream_error = FALSE;
    rc = CURLM_OK;

    if(!data->conn &&
       data->mstate > CURLM_STATE_CONNECT &&
       data->mstate < CURLM_STATE_DONE) {
      /* In all these states, the code will blindly access 'data->conn'
         so this is precaution that it isn't NULL. And it silences static
         analyzers. */
      failf(data, "In state %d with no conn, bail out!\n", data->mstate);
      return CURLM_INTERNAL_ERROR;
    }

    if(multi_ischanged(multi, TRUE)) {
      DEBUGF(infof(data, "multi changed, check CONNECT_PEND queue!\n"));
      process_pending_handles(multi); /* multiplexed */
    }

    if(data->conn && data->mstate > CURLM_STATE_CONNECT &&
       data->mstate < CURLM_STATE_COMPLETED) {
      /* Make sure we set the connection's current owner */
      data->conn->data = data;
    }

    if(data->conn &&
       (data->mstate >= CURLM_STATE_CONNECT) &&
       (data->mstate < CURLM_STATE_COMPLETED)) {
      /* we need to wait for the connect state as only then is the start time
         stored, but we must not check already completed handles */
      timeout_ms = Curl_timeleft(data, &now,
                                 (data->mstate <= CURLM_STATE_DO)?
                                 TRUE:FALSE);

      if(timeout_ms < 0) {
        /* Handle timed out */
        if(data->mstate == CURLM_STATE_WAITRESOLVE)
          failf(data, "Resolving timed out after %" CURL_FORMAT_TIMEDIFF_T
                " milliseconds",
                Curl_timediff(now, data->progress.t_startsingle));
        else if(data->mstate == CURLM_STATE_WAITCONNECT)
          failf(data, "Connection timed out after %" CURL_FORMAT_TIMEDIFF_T
                " milliseconds",
                Curl_timediff(now, data->progress.t_startsingle));
        else {
          struct SingleRequest *k = &data->req;
          if(k->size != -1) {
            failf(data, "Operation timed out after %" CURL_FORMAT_TIMEDIFF_T
                  " milliseconds with %" CURL_FORMAT_CURL_OFF_T " out of %"
                  CURL_FORMAT_CURL_OFF_T " bytes received",
                  Curl_timediff(now, data->progress.t_startsingle),
                  k->bytecount, k->size);
          }
          else {
            failf(data, "Operation timed out after %" CURL_FORMAT_TIMEDIFF_T
                  " milliseconds with %" CURL_FORMAT_CURL_OFF_T
                  " bytes received",
                  Curl_timediff(now, data->progress.t_startsingle),
                  k->bytecount);
          }
        }

        /* Force connection closed if the connection has indeed been used */
        if(data->mstate > CURLM_STATE_DO) {
          streamclose(data->conn, "Disconnected with pending data");
          stream_error = TRUE;
        }
        result = CURLE_OPERATION_TIMEDOUT;
        (void)multi_done(data, result, TRUE);
        /* Skip the statemachine and go directly to error handling section. */
        goto statemachine_end;
      }
    }

    switch(data->mstate) {
    case CURLM_STATE_INIT:
      /* init this transfer. */
      result = Curl_pretransfer(data);

      if(!result) {
        /* after init, go CONNECT */
        multistate(data, CURLM_STATE_CONNECT);
        Curl_pgrsTime(data, TIMER_STARTOP);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      break;

    case CURLM_STATE_CONNECT_PEND:
      /* We will stay here until there is a connection available. Then
         we try again in the CURLM_STATE_CONNECT state. */
      break;

    case CURLM_STATE_CONNECT:
      /* Connect. We want to get a connection identifier filled in. */
      Curl_pgrsTime(data, TIMER_STARTSINGLE);
      if(data->set.timeout)
        Curl_expire(data, data->set.timeout, EXPIRE_TIMEOUT);

      if(data->set.connecttimeout)
        Curl_expire(data, data->set.connecttimeout, EXPIRE_CONNECTTIMEOUT);

      result = Curl_connect(data, &async, &protocol_connect);
      if(CURLE_NO_CONNECTION_AVAILABLE == result) {
        /* There was no connection available. We will go to the pending
           state and wait for an available connection. */
        multistate(data, CURLM_STATE_CONNECT_PEND);

        /* add this handle to the list of connect-pending handles */
        Curl_llist_insert_next(&multi->pending, multi->pending.tail, data,
                               &data->connect_queue);
        result = CURLE_OK;
        break;
      }
      else if(data->state.previouslypending) {
        /* this transfer comes from the pending queue so try move another */
        infof(data, "Transfer was pending, now try another\n");
        process_pending_handles(data->multi);
      }

      if(!result) {
        if(async)
          /* We're now waiting for an asynchronous name lookup */
          multistate(data, CURLM_STATE_WAITRESOLVE);
        else {
          /* after the connect has been sent off, go WAITCONNECT unless the
             protocol connect is already done and we can go directly to
             WAITDO or DO! */
          rc = CURLM_CALL_MULTI_PERFORM;

          if(protocol_connect)
            multistate(data, CURLM_STATE_DO);
          else {
#ifndef CURL_DISABLE_HTTP
            if(Curl_connect_ongoing(data->conn))
              multistate(data, CURLM_STATE_WAITPROXYCONNECT);
            else
#endif
              multistate(data, CURLM_STATE_WAITCONNECT);
          }
        }
      }
      break;

    case CURLM_STATE_WAITRESOLVE:
      /* awaiting an asynch name resolve to complete */
    {
      struct Curl_dns_entry *dns = NULL;
      struct connectdata *conn = data->conn;
      const char *hostname;

      DEBUGASSERT(conn);
      if(conn->bits.httpproxy)
        hostname = conn->http_proxy.host.name;
      else if(conn->bits.conn_to_host)
        hostname = conn->conn_to_host.name;
      else
        hostname = conn->host.name;

      /* check if we have the name resolved by now */
      dns = Curl_fetch_addr(conn, hostname, (int)conn->port);

      if(dns) {
#ifdef CURLRES_ASYNCH
        conn->async.dns = dns;
        conn->async.done = TRUE;
#endif
        result = CURLE_OK;
        infof(data, "Hostname '%s' was found in DNS cache\n", hostname);
      }

      if(!dns)
        result = Curl_resolv_check(data->conn, &dns);

      /* Update sockets here, because the socket(s) may have been
         closed and the application thus needs to be told, even if it
         is likely that the same socket(s) will again be used further
         down.  If the name has not yet been resolved, it is likely
         that new sockets have been opened in an attempt to contact
         another resolver. */
      singlesocket(multi, data);

      if(dns) {
        /* Perform the next step in the connection phase, and then move on
           to the WAITCONNECT state */
        result = Curl_once_resolved(data->conn, &protocol_connect);

        if(result)
          /* if Curl_once_resolved() returns failure, the connection struct
             is already freed and gone */
          data->conn = NULL; /* no more connection */
        else {
          /* call again please so that we get the next socket setup */
          rc = CURLM_CALL_MULTI_PERFORM;
          if(protocol_connect)
            multistate(data, CURLM_STATE_DO);
          else {
#ifndef CURL_DISABLE_HTTP
            if(Curl_connect_ongoing(data->conn))
              multistate(data, CURLM_STATE_WAITPROXYCONNECT);
            else
#endif
              multistate(data, CURLM_STATE_WAITCONNECT);
          }
        }
      }

      if(result) {
        /* failure detected */
        stream_error = TRUE;
        break;
      }
    }
    break;

#ifndef CURL_DISABLE_HTTP
    case CURLM_STATE_WAITPROXYCONNECT:
      /* this is HTTP-specific, but sending CONNECT to a proxy is HTTP... */
      DEBUGASSERT(data->conn);
      result = Curl_http_connect(data->conn, &protocol_connect);

      if(data->conn->bits.proxy_connect_closed) {
        rc = CURLM_CALL_MULTI_PERFORM;
        /* connect back to proxy again */
        result = CURLE_OK;
        multi_done(data, CURLE_OK, FALSE);
        multistate(data, CURLM_STATE_CONNECT);
      }
      else if(!result) {
        if((data->conn->http_proxy.proxytype != CURLPROXY_HTTPS ||
           data->conn->bits.proxy_ssl_connected[FIRSTSOCKET]) &&
           Curl_connect_complete(data->conn)) {
          rc = CURLM_CALL_MULTI_PERFORM;
          /* initiate protocol connect phase */
          multistate(data, CURLM_STATE_SENDPROTOCONNECT);
        }
      }
      else if(result)
        stream_error = TRUE;
      break;
#endif

    case CURLM_STATE_WAITCONNECT:
      /* awaiting a completion of an asynch TCP connect */
      DEBUGASSERT(data->conn);
      result = Curl_is_connected(data->conn, FIRSTSOCKET, &connected);
      if(connected && !result) {
#ifndef CURL_DISABLE_HTTP
        if((data->conn->http_proxy.proxytype == CURLPROXY_HTTPS &&
            !data->conn->bits.proxy_ssl_connected[FIRSTSOCKET]) ||
           Curl_connect_ongoing(data->conn)) {
          multistate(data, CURLM_STATE_WAITPROXYCONNECT);
          break;
        }
#endif
        rc = CURLM_CALL_MULTI_PERFORM;
        multistate(data, data->conn->bits.tunnel_proxy?
                   CURLM_STATE_WAITPROXYCONNECT:
                   CURLM_STATE_SENDPROTOCONNECT);
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(data, result, TRUE);
        stream_error = TRUE;
        break;
      }
      break;

    case CURLM_STATE_SENDPROTOCONNECT:
      result = Curl_protocol_connect(data->conn, &protocol_connect);
      if(!result && !protocol_connect)
        /* switch to waiting state */
        multistate(data, CURLM_STATE_PROTOCONNECT);
      else if(!result) {
        /* protocol connect has completed, go WAITDO or DO */
        multistate(data, CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(data, result, TRUE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_PROTOCONNECT:
      /* protocol-specific connect phase */
      result = Curl_protocol_connecting(data->conn, &protocol_connect);
      if(!result && protocol_connect) {
        /* after the connect has completed, go WAITDO or DO */
        multistate(data, CURLM_STATE_DO);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else if(result) {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(data, result, TRUE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO:
      if(data->set.connect_only) {
        /* keep connection open for application to use the socket */
        connkeep(data->conn, "CONNECT_ONLY");
        multistate(data, CURLM_STATE_DONE);
        result = CURLE_OK;
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      else {
        /* Perform the protocol's DO action */
        result = multi_do(data, &dophase_done);

        /* When multi_do() returns failure, data->conn might be NULL! */

        if(!result) {
          if(!dophase_done) {
#ifndef CURL_DISABLE_FTP
            /* some steps needed for wildcard matching */
            if(data->state.wildcardmatch) {
              struct WildcardData *wc = &data->wildcard;
              if(wc->state == CURLWC_DONE || wc->state == CURLWC_SKIP) {
                /* skip some states if it is important */
                multi_done(data, CURLE_OK, FALSE);
                multistate(data, CURLM_STATE_DONE);
                rc = CURLM_CALL_MULTI_PERFORM;
                break;
              }
            }
#endif
            /* DO was not completed in one function call, we must continue
               DOING... */
            multistate(data, CURLM_STATE_DOING);
            rc = CURLM_OK;
          }

          /* after DO, go DO_DONE... or DO_MORE */
          else if(data->conn->bits.do_more) {
            /* we're supposed to do more, but we need to sit down, relax
               and wait a little while first */
            multistate(data, CURLM_STATE_DO_MORE);
            rc = CURLM_OK;
          }
          else {
            /* we're done with the DO, now DO_DONE */
            multistate(data, CURLM_STATE_DO_DONE);
            rc = CURLM_CALL_MULTI_PERFORM;
          }
        }
        else if((CURLE_SEND_ERROR == result) &&
                data->conn->bits.reuse) {
          /*
           * In this situation, a connection that we were trying to use
           * may have unexpectedly died.  If possible, send the connection
           * back to the CONNECT phase so we can try again.
           */
          char *newurl = NULL;
          followtype follow = FOLLOW_NONE;
          CURLcode drc;

          drc = Curl_retry_request(data->conn, &newurl);
          if(drc) {
            /* a failure here pretty much implies an out of memory */
            result = drc;
            stream_error = TRUE;
          }

          Curl_posttransfer(data);
          drc = multi_done(data, result, FALSE);

          /* When set to retry the connection, we must to go back to
           * the CONNECT state */
          if(newurl) {
            if(!drc || (drc == CURLE_SEND_ERROR)) {
              follow = FOLLOW_RETRY;
              drc = Curl_follow(data, newurl, follow);
              if(!drc) {
                multistate(data, CURLM_STATE_CONNECT);
                rc = CURLM_CALL_MULTI_PERFORM;
                result = CURLE_OK;
              }
              else {
                /* Follow failed */
                result = drc;
              }
            }
            else {
              /* done didn't return OK or SEND_ERROR */
              result = drc;
            }
          }
          else {
            /* Have error handler disconnect conn if we can't retry */
            stream_error = TRUE;
          }
          free(newurl);
        }
        else {
          /* failure detected */
          Curl_posttransfer(data);
          if(data->conn)
            multi_done(data, result, FALSE);
          stream_error = TRUE;
        }
      }
      break;

    case CURLM_STATE_DOING:
      /* we continue DOING until the DO phase is complete */
      DEBUGASSERT(data->conn);
      result = Curl_protocol_doing(data->conn,
                                   &dophase_done);
      if(!result) {
        if(dophase_done) {
          /* after DO, go DO_DONE or DO_MORE */
          multistate(data, data->conn->bits.do_more?
                     CURLM_STATE_DO_MORE:
                     CURLM_STATE_DO_DONE);
          rc = CURLM_CALL_MULTI_PERFORM;
        } /* dophase_done */
      }
      else {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(data, result, FALSE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO_MORE:
      /*
       * When we are connected, DO MORE and then go DO_DONE
       */
      DEBUGASSERT(data->conn);
      result = multi_do_more(data->conn, &control);

      if(!result) {
        if(control) {
          /* if positive, advance to DO_DONE
             if negative, go back to DOING */
          multistate(data, control == 1?
                     CURLM_STATE_DO_DONE:
                     CURLM_STATE_DOING);
          rc = CURLM_CALL_MULTI_PERFORM;
        }
        else
          /* stay in DO_MORE */
          rc = CURLM_OK;
      }
      else {
        /* failure detected */
        Curl_posttransfer(data);
        multi_done(data, result, FALSE);
        stream_error = TRUE;
      }
      break;

    case CURLM_STATE_DO_DONE:
      DEBUGASSERT(data->conn);
      if(data->conn->bits.multiplex)
        /* Check if we can move pending requests to send pipe */
        process_pending_handles(multi); /*  multiplexed */

      /* Only perform the transfer if there's a good socket to work with.
         Having both BAD is a signal to skip immediately to DONE */
      if((data->conn->sockfd != CURL_SOCKET_BAD) ||
         (data->conn->writesockfd != CURL_SOCKET_BAD))
        multistate(data, CURLM_STATE_PERFORM);
      else {
#ifndef CURL_DISABLE_FTP
        if(data->state.wildcardmatch &&
           ((data->conn->handler->flags & PROTOPT_WILDCARD) == 0)) {
          data->wildcard.state = CURLWC_DONE;
        }
#endif
        multistate(data, CURLM_STATE_DONE);
      }
      rc = CURLM_CALL_MULTI_PERFORM;
      break;

    case CURLM_STATE_TOOFAST: /* limit-rate exceeded in either direction */
      DEBUGASSERT(data->conn);
      /* if both rates are within spec, resume transfer */
      if(Curl_pgrsUpdate(data->conn))
        result = CURLE_ABORTED_BY_CALLBACK;
      else
        result = Curl_speedcheck(data, now);

      if(!result) {
        send_timeout_ms = 0;
        if(data->set.max_send_speed > 0)
          send_timeout_ms =
            Curl_pgrsLimitWaitTime(data->progress.uploaded,
                                   data->progress.ul_limit_size,
                                   data->set.max_send_speed,
                                   data->progress.ul_limit_start,
                                   now);

        recv_timeout_ms = 0;
        if(data->set.max_recv_speed > 0)
          recv_timeout_ms =
            Curl_pgrsLimitWaitTime(data->progress.downloaded,
                                   data->progress.dl_limit_size,
                                   data->set.max_recv_speed,
                                   data->progress.dl_limit_start,
                                   now);

        if(!send_timeout_ms && !recv_timeout_ms) {
          multistate(data, CURLM_STATE_PERFORM);
          Curl_ratelimit(data, now);
        }
        else if(send_timeout_ms >= recv_timeout_ms)
          Curl_expire(data, send_timeout_ms, EXPIRE_TOOFAST);
        else
          Curl_expire(data, recv_timeout_ms, EXPIRE_TOOFAST);
      }
      break;

    case CURLM_STATE_PERFORM:
    {
      char *newurl = NULL;
      bool retry = FALSE;
      bool comeback = FALSE;

      /* check if over send speed */
      send_timeout_ms = 0;
      if(data->set.max_send_speed > 0)
        send_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.uploaded,
                                                 data->progress.ul_limit_size,
                                                 data->set.max_send_speed,
                                                 data->progress.ul_limit_start,
                                                 now);

      /* check if over recv speed */
      recv_timeout_ms = 0;
      if(data->set.max_recv_speed > 0)
        recv_timeout_ms = Curl_pgrsLimitWaitTime(data->progress.downloaded,
                                                 data->progress.dl_limit_size,
                                                 data->set.max_recv_speed,
                                                 data->progress.dl_limit_start,
                                                 now);

      if(send_timeout_ms || recv_timeout_ms) {
        Curl_ratelimit(data, now);
        multistate(data, CURLM_STATE_TOOFAST);
        if(send_timeout_ms >= recv_timeout_ms)
          Curl_expire(data, send_timeout_ms, EXPIRE_TOOFAST);
        else
          Curl_expire(data, recv_timeout_ms, EXPIRE_TOOFAST);
        break;
      }

      /* read/write data if it is ready to do so */
      result = Curl_readwrite(data->conn, data, &done, &comeback);

      if(done || (result == CURLE_RECV_ERROR)) {
        /* If CURLE_RECV_ERROR happens early enough, we assume it was a race
         * condition and the server closed the re-used connection exactly when
         * we wanted to use it, so figure out if that is indeed the case.
         */
        CURLcode ret = Curl_retry_request(data->conn, &newurl);
        if(!ret)
          retry = (newurl)?TRUE:FALSE;
        else if(!result)
          result = ret;

        if(retry) {
          /* if we are to retry, set the result to OK and consider the
             request as done */
          result = CURLE_OK;
          done = TRUE;
        }
      }
      else if((CURLE_HTTP2_STREAM == result) &&
              Curl_h2_http_1_1_error(data->conn)) {
        CURLcode ret = Curl_retry_request(data->conn, &newurl);

        if(!ret) {
          infof(data, "Downgrades to HTTP/1.1!\n");
          data->set.httpversion = CURL_HTTP_VERSION_1_1;
          /* clear the error message bit too as we ignore the one we got */
          data->state.errorbuf = FALSE;
          if(!newurl)
            /* typically for HTTP_1_1_REQUIRED error on first flight */
            newurl = strdup(data->change.url);
          /* if we are to retry, set the result to OK and consider the request
             as done */
          retry = TRUE;
          result = CURLE_OK;
          done = TRUE;
        }
        else
          result = ret;
      }

      if(result) {
        /*
         * The transfer phase returned error, we mark the connection to get
         * closed to prevent being re-used. This is because we can't possibly
         * know if the connection is in a good shape or not now.  Unless it is
         * a protocol which uses two "channels" like FTP, as then the error
         * happened in the data connection.
         */

        if(!(data->conn->handler->flags & PROTOPT_DUAL) &&
           result != CURLE_HTTP2_STREAM)
          streamclose(data->conn, "Transfer returned error");

        Curl_posttransfer(data);
        multi_done(data, result, TRUE);
      }
      else if(done) {
        followtype follow = FOLLOW_NONE;

        /* call this even if the readwrite function returned error */
        Curl_posttransfer(data);

        /* When we follow redirects or is set to retry the connection, we must
           to go back to the CONNECT state */
        if(data->req.newurl || retry) {
          if(!retry) {
            /* if the URL is a follow-location and not just a retried request
               then figure out the URL here */
            free(newurl);
            newurl = data->req.newurl;
            data->req.newurl = NULL;
            follow = FOLLOW_REDIR;
          }
          else
            follow = FOLLOW_RETRY;
          (void)multi_done(data, CURLE_OK, FALSE);
          /* multi_done() might return CURLE_GOT_NOTHING */
          result = Curl_follow(data, newurl, follow);
          if(!result) {
            multistate(data, CURLM_STATE_CONNECT);
            rc = CURLM_CALL_MULTI_PERFORM;
          }
          free(newurl);
        }
        else {
          /* after the transfer is done, go DONE */

          /* but first check to see if we got a location info even though we're
             not following redirects */
          if(data->req.location) {
            free(newurl);
            newurl = data->req.location;
            data->req.location = NULL;
            result = Curl_follow(data, newurl, FOLLOW_FAKE);
            free(newurl);
            if(result) {
              stream_error = TRUE;
              result = multi_done(data, result, TRUE);
            }
          }

          if(!result) {
            multistate(data, CURLM_STATE_DONE);
            rc = CURLM_CALL_MULTI_PERFORM;
          }
        }
      }
      else if(comeback)
        rc = CURLM_CALL_MULTI_PERFORM;
      break;
    }

    case CURLM_STATE_DONE:
      /* this state is highly transient, so run another loop after this */
      rc = CURLM_CALL_MULTI_PERFORM;

      if(data->conn) {
        CURLcode res;

        if(data->conn->bits.multiplex)
          /* Check if we can move pending requests to connection */
          process_pending_handles(multi); /* multiplexing */

        /* post-transfer command */
        res = multi_done(data, result, FALSE);

        /* allow a previously set error code take precedence */
        if(!result)
          result = res;

        /*
         * If there are other handles on the connection, multi_done won't set
         * conn to NULL.  In such a case, curl_multi_remove_handle() can
         * access free'd data, if the connection is free'd and the handle
         * removed before we perform the processing in CURLM_STATE_COMPLETED
         */
        if(data->conn)
          detach_connnection(data);
      }

#ifndef CURL_DISABLE_FTP
      if(data->state.wildcardmatch) {
        if(data->wildcard.state != CURLWC_DONE) {
          /* if a wildcard is set and we are not ending -> lets start again
             with CURLM_STATE_INIT */
          multistate(data, CURLM_STATE_INIT);
          break;
        }
      }
#endif
      /* after we have DONE what we're supposed to do, go COMPLETED, and
         it doesn't matter what the multi_done() returned! */
      multistate(data, CURLM_STATE_COMPLETED);
      break;

    case CURLM_STATE_COMPLETED:
      break;

    case CURLM_STATE_MSGSENT:
      data->result = result;
      return CURLM_OK; /* do nothing */

    default:
      return CURLM_INTERNAL_ERROR;
    }
    statemachine_end:

    if(data->mstate < CURLM_STATE_COMPLETED) {
      if(result) {
        /*
         * If an error was returned, and we aren't in completed state now,
         * then we go to completed and consider this transfer aborted.
         */

        /* NOTE: no attempt to disconnect connections must be made
           in the case blocks above - cleanup happens only here */

        /* Check if we can move pending requests to send pipe */
        process_pending_handles(multi); /* connection */

        if(data->conn) {
          if(stream_error) {
            /* Don't attempt to send data over a connection that timed out */
            bool dead_connection = result == CURLE_OPERATION_TIMEDOUT;
            /* disconnect properly */
            Curl_disconnect(data, data->conn, dead_connection);

            /* This is where we make sure that the conn pointer is reset.
               We don't have to do this in every case block above where a
               failure is detected */
            detach_connnection(data);
          }
        }
        else if(data->mstate == CURLM_STATE_CONNECT) {
          /* Curl_connect() failed */
          (void)Curl_posttransfer(data);
        }

        multistate(data, CURLM_STATE_COMPLETED);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
      /* if there's still a connection to use, call the progress function */
      else if(data->conn && Curl_pgrsUpdate(data->conn)) {
        /* aborted due to progress callback return code must close the
           connection */
        result = CURLE_ABORTED_BY_CALLBACK;
        streamclose(data->conn, "Aborted by callback");

        /* if not yet in DONE state, go there, otherwise COMPLETED */
        multistate(data, (data->mstate < CURLM_STATE_DONE)?
                   CURLM_STATE_DONE: CURLM_STATE_COMPLETED);
        rc = CURLM_CALL_MULTI_PERFORM;
      }
    }

    if(CURLM_STATE_COMPLETED == data->mstate) {
      if(data->set.fmultidone) {
        /* signal via callback instead */
        data->set.fmultidone(data, result);
      }
      else {
        /* now fill in the Curl_message with this info */
        msg = &data->msg;

        msg->extmsg.msg = CURLMSG_DONE;
        msg->extmsg.easy_handle = data;
        msg->extmsg.data.result = result;

        rc = multi_addmsg(multi, msg);
        DEBUGASSERT(!data->conn);
      }
      multistate(data, CURLM_STATE_MSGSENT);
    }
  } while((rc == CURLM_CALL_MULTI_PERFORM) || multi_ischanged(multi, FALSE));

  data->result = result;
  return rc;
}